

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitcoin-tx.cpp
# Opt level: O1

void RegisterSetJson(string *key,string *rawJson)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ssize_t sVar2;
  mapped_type *pmVar3;
  runtime_error *this;
  size_t in_RCX;
  long in_FS_OFFSET;
  string strErr;
  UniValue val;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  UniValue local_80;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  paVar1 = &local_80.val.field_2;
  local_80.val._M_string_length = 0;
  local_80.val.field_2._M_local_buf[0] = '\0';
  local_80.typ = VNULL;
  local_80.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_80.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_80.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_80.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_80.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_80.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_80.val._M_dataplus._M_p = (pointer)paVar1;
  sVar2 = UniValue::read(&local_80,(int)rawJson->_M_string_length,(rawJson->_M_dataplus)._M_p,in_RCX
                        );
  if ((char)sVar2 == '\0') {
    std::operator+(&local_a0,"Cannot parse JSON for key ",key);
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,(string *)&local_a0);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else {
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
             ::operator[](&registers_abi_cxx11_,key);
    pmVar3->typ = local_80.typ;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              (&pmVar3->val,&local_80.val);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(&pmVar3->keys,&local_80.keys);
    std::vector<UniValue,_std::allocator<UniValue>_>::operator=(&pmVar3->values,&local_80.values);
    std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_80.values);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_80.keys);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80.val._M_dataplus._M_p != paVar1) {
      operator_delete(local_80.val._M_dataplus._M_p,
                      CONCAT71(local_80.val.field_2._M_allocated_capacity._1_7_,
                               local_80.val.field_2._M_local_buf[0]) + 1);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

static void RegisterSetJson(const std::string& key, const std::string& rawJson)
{
    UniValue val;
    if (!val.read(rawJson)) {
        std::string strErr = "Cannot parse JSON for key " + key;
        throw std::runtime_error(strErr);
    }

    registers[key] = val;
}